

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void in_ALDX(PDISASM pMyDisasm)

{
  (pMyDisasm->Instruction).Category = 0x10008;
  (pMyDisasm->Instruction).Mnemonic[0] = 'i';
  (pMyDisasm->Instruction).Mnemonic[1] = 'n';
  (pMyDisasm->Instruction).Mnemonic[2] = '\0';
  strcpy((pMyDisasm->Operand1).OpMnemonic,Registers8Bits[0]);
  strcpy((pMyDisasm->Operand2).OpMnemonic,Registers16Bits[2]);
  (pMyDisasm->Operand1).OpType = 0x20000;
  (pMyDisasm->Operand1).Registers.type = 1;
  (pMyDisasm->Operand1).Registers.gpr = REGS[0];
  (pMyDisasm->Operand1).OpSize = 8;
  (pMyDisasm->Operand2).OpType = 0x20000;
  (pMyDisasm->Operand2).Registers.type = 1;
  (pMyDisasm->Operand2).Registers.gpr = REGS[2];
  (pMyDisasm->Operand2).OpSize = 0x10;
  (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
  return;
}

Assistant:

void __bea_callspec__ in_ALDX(PDISASM pMyDisasm)
{
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+InOutINSTRUCTION;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "in");
    #endif
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers8Bits[0]);
    #endif
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy ((char*) pMyDisasm->Operand2.OpMnemonic, Registers16Bits[2]);
    #endif
    pMyDisasm->Operand1.OpType = REGISTER_TYPE;
    pMyDisasm->Operand1.Registers.type = GENERAL_REG;
    pMyDisasm->Operand1.Registers.gpr = REGS[0];
    pMyDisasm->Operand1.OpSize = 8;
    pMyDisasm->Operand2.OpType = REGISTER_TYPE;
    pMyDisasm->Operand2.Registers.type = GENERAL_REG;
    pMyDisasm->Operand2.Registers.gpr = REGS[2];
    pMyDisasm->Operand2.OpSize = 16;
    GV.EIP_++;
}